

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# await.c
# Opt level: O2

int main(void)

{
  int iVar1;
  callable_t callable;
  int *__ptr;
  undefined4 local_1c [2];
  int n;
  
  thread_pool_init(&pool,2);
  local_1c[0] = 0x10;
  callable.arg = local_1c;
  callable.function = squared;
  callable.argsz = 4;
  async(&pool,&future,callable);
  __ptr = (int *)await(&future);
  iVar1 = *__ptr;
  if (iVar1 == 0x100) {
    free(__ptr);
    thread_pool_destroy(&pool);
    tests_run = tests_run + 1;
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c ALL TESTS PASSED"
        );
  }
  else {
    tests_run = tests_run + 1;
    printf("/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c %s\n"
           ,"expected 256");
  }
  printf("/workspace/llm4binary/github/license_all_cmakelists_25/Gor027[P]Thread_Pool/test/await.c Tests run: %d\n"
         ,(ulong)(uint)tests_run);
  return (int)(iVar1 != 0x100);
}

Assistant:

int main() {
  char *result = all_tests();
  if (result != 0) {
    printf(__FILE__ " %s\n", result);
  } else {
    printf(__FILE__ " ALL TESTS PASSED\n");
  }
  printf(__FILE__ " Tests run: %d\n", tests_run);

  return result != 0;
}